

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_GetVersion_Test::TestBody(AbstractTransaction_GetVersion_Test *this)

{
  char *message;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertionResult gtest_ar;
  Transaction tx;
  
  cfd::core::Transaction::Transaction(&tx,2,3);
  local_60.ptr_._0_4_ = cfd::core::AbstractTransaction::GetVersion(&tx.super_AbstractTransaction);
  local_68.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"tx.GetVersion()","2",(int *)&local_60,(int *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x58,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Transaction::~Transaction(&tx);
  return;
}

Assistant:

TEST(AbstractTransaction, GetVersion) {
  Transaction tx(2, 3);
  EXPECT_EQ(tx.GetVersion(), 2);
}